

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::DeleteItem
               (RecyclableObject *object,uint64 index,PropertyOperationFlags propertyOperationFlags)

{
  uint64 instance;
  PropertyId propertyId;
  BOOL BVar1;
  ScriptContext *scriptContext;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  uint64 uStack_18;
  PropertyOperationFlags propertyOperationFlags_local;
  uint64 index_local;
  RecyclableObject *object_local;
  
  local_28 = (PropertyRecord *)0x0;
  propertyRecord._4_4_ = propertyOperationFlags;
  uStack_18 = index;
  index_local = (uint64)object;
  scriptContext = RecyclableObject::GetScriptContext(object);
  GetPropertyIdForInt(index,scriptContext,&local_28);
  instance = index_local;
  propertyId = PropertyRecord::GetPropertyId(local_28);
  BVar1 = DeleteProperty((RecyclableObject *)instance,propertyId,propertyRecord._4_4_);
  return BVar1;
}

Assistant:

BOOL JavascriptOperators::DeleteItem(RecyclableObject* object, uint64 index, PropertyOperationFlags propertyOperationFlags)
    {
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptOperators::GetPropertyIdForInt(index, object->GetScriptContext(), &propertyRecord);
        return JavascriptOperators::DeleteProperty(object, propertyRecord->GetPropertyId(), propertyOperationFlags);
    }